

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodedstream.h
# Opt level: O1

void __thiscall
rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::EncodedInputStream
          (EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *this,MemoryStream *is
          )

{
  char *pcVar1;
  char *pcVar2;
  
  this->is_ = is;
  pcVar1 = is->src_;
  pcVar2 = is->end_;
  if ((pcVar1 != pcVar2) && (*pcVar1 == -0x11)) {
    is->src_ = pcVar1 + 1;
  }
  pcVar1 = is->src_;
  if ((pcVar1 != pcVar2) && (*pcVar1 == -0x45)) {
    is->src_ = pcVar1 + 1;
  }
  pcVar1 = is->src_;
  if ((pcVar1 != pcVar2) && (*pcVar1 == -0x41)) {
    is->src_ = pcVar1 + 1;
  }
  return;
}

Assistant:

EncodedInputStream(MemoryStream& is) : is_(is) {
        if (static_cast<unsigned char>(is_.Peek()) == 0xEFu) is_.Take();
        if (static_cast<unsigned char>(is_.Peek()) == 0xBBu) is_.Take();
        if (static_cast<unsigned char>(is_.Peek()) == 0xBFu) is_.Take();
    }